

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::isolatePriorModifier(string *unit_string,string *modifier,char check1,char check2)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  undefined1 *puVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  char cVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool local_69;
  size_type divloc2;
  size_type divloc;
  bool skip;
  size_type nspace;
  size_type kloc;
  size_type offset;
  size_type modfind;
  bool modified;
  char check2_local;
  char check1_local;
  string *modifier_local;
  string *unit_string_local;
  
  modfind._5_1_ = false;
  uVar3 = std::__cxx11::string::find((string *)unit_string,(ulong)modifier);
  if (uVar3 != 0xffffffffffffffff) {
    std::__cxx11::string::size();
    std::__cxx11::string::back();
    cVar10 = (char)unit_string;
    lVar4 = std::__cxx11::string::find_first_not_of(cVar10,0x20);
    if ((lVar4 != -1) &&
       ((pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)unit_string), *pcVar5 == check1 ||
        (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)unit_string), *pcVar5 == check2)))
       ) {
      puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)unit_string);
      *puVar6 = 0x5f;
      modfind._5_1_ = true;
    }
    uVar7 = std::__cxx11::string::find_first_of(cVar10,0x20);
    uVar8 = std::__cxx11::string::size();
    divloc._7_1_ = uVar8 <= uVar7;
    if (!divloc._7_1_) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
      bVar1 = isOperator(*pcVar5);
      local_69 = true;
      if (!bVar1) {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
        local_69 = isOperator(*pcVar5);
      }
      divloc._7_1_ = local_69;
    }
    if (divloc._7_1_ == false) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
      bVar1 = true;
      if (*pcVar5 != '(') {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
        bVar1 = *pcVar5 == '(';
      }
      bVar11 = true;
      if (!bVar1) {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
        bVar11 = true;
        if (*pcVar5 != '-') {
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
          bVar11 = *pcVar5 == '-';
        }
      }
      bVar12 = true;
      if (!bVar1 && !bVar11) {
        iVar2 = std::__cxx11::string::compare((ulong)unit_string,uVar7 + 1,(char *)0x2);
        bVar12 = iVar2 == 0;
      }
      bVar13 = true;
      if ((!bVar1 && !bVar11) && !bVar12) {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
        bVar13 = *pcVar5 == 'U';
      }
      divloc._7_1_ = ((bVar1 || bVar11) || bVar12) || bVar13;
    }
    if (divloc._7_1_ == false) {
      uVar8 = std::__cxx11::string::find_last_of(cVar10,0x2f);
      uVar9 = std::__cxx11::string::find_first_of(cVar10,0x2f);
      if (uVar8 < uVar3) {
        std::__cxx11::string::insert((ulong)unit_string,uVar8 + 1,'\x01');
        if (uVar9 == 0xffffffffffffffff) {
          std::__cxx11::string::push_back(cVar10);
        }
        else {
          std::__cxx11::string::insert((ulong)unit_string,uVar9 + 1,'\x01');
        }
        divloc._7_1_ = uVar9 < uVar7 + 1;
        modfind._5_1_ = true;
      }
      else if (uVar9 < uVar7) {
        divloc._7_1_ = true;
      }
    }
    if (divloc._7_1_ == false) {
      puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)unit_string);
      *puVar6 = 0x2a;
      modfind._5_1_ = true;
    }
  }
  return modfind._5_1_;
}

Assistant:

static bool isolatePriorModifier(
    std::string& unit_string,
    const std::string& modifier,
    char check1,
    char check2)
{
    bool modified{false};
    auto modfind = unit_string.find(modifier);
    if (modfind != std::string::npos) {
        auto offset = modfind + modifier.size();
        // LCOV_EXCL_START
        // this condition is not used in current use cases but it is dangerous
        // to make assumptions that will always be the case
        if (modifier.back() != ' ') {
            ++offset;
        }
        // LCOV_EXCL_STOP
        auto kloc = unit_string.find_first_not_of(' ', offset);
        if (kloc != std::string::npos &&
            (unit_string[kloc] == check1 || unit_string[kloc] == check2)) {
            // this handles a misinterpretation of square+d to squared when in
            // middle of a unit
            unit_string[kloc - 1] = '_';
            modified = true;
        }
        auto nspace = unit_string.find_first_of(' ', kloc);
        auto skip = (nspace >= unit_string.size());
        if (!skip) {
            skip = isOperator(unit_string[nspace + 1]) ||
                isOperator(unit_string[nspace - 1]);
        }
        if (!skip) {
            skip = unit_string[nspace + 1] == '(' ||
                unit_string[nspace - 1] == '(';
            skip |=
                (skip || unit_string[nspace + 1] == '-' ||
                 unit_string[nspace - 1] == '-');
            skip |= skip || (unit_string.compare(nspace + 1, 2, "of") == 0);
            skip |= skip ||
                unit_string[nspace + 1] ==
                    'U';  // handle distance units with UK or US modifier
        }
        if (!skip) {
            auto divloc = unit_string.find_last_of('/', modfind);
            auto divloc2 = unit_string.find_first_of('/', modfind + 1);
            if (divloc < modfind) {
                unit_string.insert(divloc + 1, 1, '(');
                ++nspace;
                if (divloc2 != std::string::npos) {
                    unit_string.insert(divloc2 + 1, 1, ')');
                    // don't worry about nspace increment here as it will be
                    // skipped or the insertion after the space
                } else {
                    unit_string.push_back(')');
                }

                skip |= (divloc2 < nspace);
                modified = true;
            } else if (divloc2 < nspace) {
                skip = true;
            }
        }
        if (!skip) {
            unit_string[nspace] = '*';
            modified = true;
        }
    }
    return modified;
}